

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_test_properties.hpp
# Opt level: O3

void run_map_test<boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>>
               (void)

{
  bool v;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_58 [32];
  string local_38;
  
  run_common_test<boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>>
            ();
  local_38._M_dataplus._M_p = local_58 + 0x30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_58 + 0x20),
             "\n                                 k=v\n                                 k=v2\n                                 "
             ,"");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_98,(char (*) [2])0x12e23c,(char (*) [2])"v");
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<std::__cxx11::string,std::__cxx11::string>,boost::container::dtl::select1st<std::__cxx11::string>,std::less<std::__cxx11::string>,boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::insert_unique<boost::container::dtl::pair<std::__cxx11::string,std::__cxx11::string>const*>
            ((flat_tree<boost::container::dtl::pair<std::__cxx11::string,std::__cxx11::string>,boost::container::dtl::select1st<std::__cxx11::string>,std::less<std::__cxx11::string>,boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)local_58,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_98,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_58);
  v = properties_eq<boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>>
                ((string *)(local_58 + 0x20),
                 (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                  *)local_58);
  boost::detail::test_impl
            ("(properties_eq<T, V>(R\"(\n                                 k=v\n                                 k=v2\n                                 )\", {{\"k\", \"v\"}}))"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/glywk[P]cpp_properties/test/parser/common_test_properties.hpp"
             ,0x28,
             "void run_map_test() [T = boost::container::flat_map<std::basic_string<char>, std::basic_string<char>>, V = boost::container::flat_map<std::basic_string<char>, std::basic_string<char>>]"
             ,v);
  boost::container::
  vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
  ::~vector((vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
             *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.second._M_dataplus._M_p != &local_98.second.field_2) {
    operator_delete(local_98.second._M_dataplus._M_p,
                    local_98.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
    operator_delete(local_98.first._M_dataplus._M_p,local_98.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_38._M_dataplus._M_p != local_58 + 0x30) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void run_map_test() {

  run_common_test<T, V>();

  // duplicate keep first key insertion
  {
    BOOST_TEST((properties_eq<T, V>(R"(
                                 k=v
                                 k=v2
                                 )",
                                    {{"k", "v"}})));
  }
}